

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_account.c
# Opt level: O0

size_t IoTHubAccount_GetIoTHubPartitionCount(IOTHUB_ACCOUNT_INFO_HANDLE acctHandle)

{
  char *__nptr;
  char *envVarValue;
  int value;
  IOTHUB_ACCOUNT_INFO_HANDLE acctHandle_local;
  
  __nptr = getenv("IOTHUB_PARTITION_COUNT");
  if (__nptr == (char *)0x0) {
    envVarValue._4_4_ = 0x10;
  }
  else {
    envVarValue._4_4_ = atoi(__nptr);
  }
  return (long)envVarValue._4_4_;
}

Assistant:

const size_t IoTHubAccount_GetIoTHubPartitionCount(IOTHUB_ACCOUNT_INFO_HANDLE acctHandle)
{
    int value;
    (void)acctHandle;
#ifdef MBED_BUILD_TIMESTAMP
    char* str_value;
    if ((str_value = getMbedParameter("IOTHUB_PARTITION_COUNT")) != NULL)
    {
        sscanf(str_value, "%i", &value);
    }
#else
    char *envVarValue = getenv("IOTHUB_PARTITION_COUNT");
    if (envVarValue != NULL)
    {
        value = atoi(envVarValue);
    }
    else
    {
        value = DEFAULT_PARTITION_COUNT;
    }
#endif
    return (size_t)value;
}